

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferActiveUniformValidation.cpp
# Opt level: O0

void __thiscall
glcts::TextureBufferActiveUniformValidationCS::createProgram
          (TextureBufferActiveUniformValidationCS *this)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestError *this_00;
  char *local_20;
  char *csCode;
  Functions *gl;
  TextureBufferActiveUniformValidationCS *this_local;
  
  gl = (Functions *)this;
  pRVar5 = deqp::Context::getRenderContext
                     ((this->super_TextureBufferActiveUniformValidation).super_TestCaseBase.
                      m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  csCode = (char *)CONCAT44(extraout_var,iVar2);
  GVar3 = (**(code **)(csCode + 0x3c8))();
  (this->super_TextureBufferActiveUniformValidation).m_po_id = GVar3;
  dVar4 = (**(code **)(csCode + 0x800))();
  glu::checkError(dVar4,"Error creating program object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                  ,0x296);
  GVar3 = (**(code **)(csCode + 0x3f0))(0x91b9);
  this->m_cs_id = GVar3;
  dVar4 = (**(code **)(csCode + 0x800))();
  glu::checkError(dVar4,"Error creating shader object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                  ,0x299);
  local_20 = getComputeShaderCode(this);
  bVar1 = TestCaseBase::buildProgram
                    ((TestCaseBase *)this,(this->super_TextureBufferActiveUniformValidation).m_po_id
                     ,this->m_cs_id,1,&local_20,(bool *)0x0);
  if (!bVar1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Error building a program!",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
               ,0x29f);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return;
}

Assistant:

void TextureBufferActiveUniformValidationCS::createProgram(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating program object!");

	m_cs_id = gl.createShader(GL_COMPUTE_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating shader object!");

	const char* csCode = getComputeShaderCode();

	if (!buildProgram(m_po_id, m_cs_id, 1, &csCode))
	{
		TCU_FAIL("Error building a program!");
	}
}